

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O0

void __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t::stat_impl<false>
          (data_t *this,uint64_t *count,
          vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
          *result,int i)

{
  uint16_t uVar1;
  __pointer_type this_00;
  size_type sVar2;
  short in_CX;
  size_type in_RDX;
  long *in_RSI;
  __int_type_conflict value;
  int j;
  __pointer_type piece;
  memory_order __b;
  size_type in_stack_ffffffffffffff98;
  array<std::atomic<std::array<std::atomic<unsigned_long>,_128UL>_*>,_128UL>
  *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar3;
  undefined2 in_stack_ffffffffffffffac;
  undefined2 in_stack_ffffffffffffffae;
  __pointer_type this_01;
  int local_44;
  
  std::array<std::atomic<std::array<std::atomic<unsigned_long>,_128UL>_*>,_128UL>::operator[]
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = std::atomic<std::array<std::atomic<unsigned_long>,_128UL>_*>::load
                      ((atomic<std::array<std::atomic<unsigned_long>,_128UL>_*> *)
                       CONCAT26(in_stack_ffffffffffffffae,
                                CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
                       (memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  if (this_00 != (__pointer_type)0x0) {
    sVar2 = std::array<std::atomic<unsigned_long>,_128UL>::size(this_00);
    local_44 = (int)sVar2;
    while (local_44 = local_44 + -1, -1 < local_44) {
      in_stack_ffffffffffffffa0 =
           (array<std::atomic<std::array<std::atomic<unsigned_long>,_128UL>_*>,_128UL> *)
           std::array<std::atomic<unsigned_long>,_128UL>::operator[]
                     ((array<std::atomic<unsigned_long>,_128UL> *)in_stack_ffffffffffffffa0,
                      in_stack_ffffffffffffff98);
      std::operator&(relaxed,__memory_order_mask);
      uVar3 = 0;
      this_01 = in_stack_ffffffffffffffa0->_M_elems[0]._M_b._M_p;
      if (this_01 != (__pointer_type)0x0) {
        in_stack_ffffffffffffff98 = in_RDX;
        uVar1 = get_ordered_index(in_CX * 0x80 + (short)local_44);
        std::vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>::
        emplace_back<unsigned_short,unsigned_long&>
                  ((vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
                    *)this_01,
                   (unsigned_short *)CONCAT26(uVar1,CONCAT24(in_stack_ffffffffffffffac,uVar3)),
                   (unsigned_long *)in_stack_ffffffffffffffa0);
        *in_RSI = (long)&this_01->_M_elems[0].super___atomic_base<unsigned_long>._M_i + *in_RSI;
      }
    }
  }
  return;
}

Assistant:

void stat_impl(uint64_t& count,
                   std::vector<std::pair<int16_t, uint_type>>& result, int i) {
      auto piece = arr[i].load(std::memory_order_relaxed);
      if (piece) {
        if constexpr (inc_order) {
          for (int j = 0; j < piece->size(); ++j) {
            auto value = (*piece)[j].load(std::memory_order_relaxed);
            if (value) {
              result.emplace_back(get_ordered_index(i * piece_size + j), value);
              count += value;
            }
          }
        }
        else {
          for (int j = piece->size() - 1; j >= 0; --j) {
            auto value = (*piece)[j].load(std::memory_order_relaxed);
            if (value) {
              result.emplace_back(get_ordered_index(i * piece_size + j), value);
              count += value;
            }
          }
        }
      }
    }